

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::clear(raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        *this)

{
  void *pvVar1;
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  
  if (this->size_ != 0) {
    if (0x7f < this->capacity_) {
      destroy_slots(this);
      return;
    }
    if (this->capacity_ != 0) {
      sVar2 = this->capacity_;
      if (sVar2 != 0) {
        lVar3 = 0x10;
        sVar4 = 0;
        do {
          if ((-1 < this->ctrl_[sVar4]) &&
             (pvVar1 = *(void **)((long)this->slots_ + lVar3 + -0x10),
             (void *)((long)this->slots_ + lVar3) != pvVar1)) {
            operator_delete(pvVar1);
          }
          sVar4 = sVar4 + 1;
          sVar2 = this->capacity_;
          lVar3 = lVar3 + 0x28;
        } while (sVar4 != sVar2);
      }
      this->size_ = 0;
      memset(this->ctrl_,0x80,sVar2 + 0x10);
      this->ctrl_[this->capacity_] = -1;
      (this->settings_).
      super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
      .
      super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_0UL,_false>
      .value = this->capacity_ - ((this->capacity_ >> 3) + this->size_);
    }
  }
  return;
}

Assistant:

size_t capacity() const { return capacity_; }